

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

void celero::console::SetConsoleColor(ConsoleColor x)

{
  char *pcVar1;
  
  switch(x) {
  case Red:
    pcVar1 = "\x1b[49m\x1b[31m";
    goto LAB_0012b3af;
  case Red_Bold:
    pcVar1 = "\x1b[49m\x1b[1;31m";
    break;
  case Green:
    pcVar1 = "\x1b[49m\x1b[32m";
    goto LAB_0012b3af;
  case Green_Bold:
    pcVar1 = "\x1b[49m\x1b[1;32m";
    break;
  case Blue:
    pcVar1 = "\x1b[49m\x1b[34m";
    goto LAB_0012b3af;
  case Blue_Bold:
    pcVar1 = "\x1b[49m\x1b[1;34m";
    break;
  case Cyan:
    pcVar1 = "\x1b[49m\x1b[36m";
    goto LAB_0012b3af;
  case Cyan_Bold:
    pcVar1 = "\x1b[49m\x1b[1;36m";
    break;
  case Yellow:
    pcVar1 = "\x1b[49m\x1b[33m";
    goto LAB_0012b3af;
  case Yellow_Bold:
    pcVar1 = "\x1b[49m\x1b[1;33m";
    break;
  case White:
    pcVar1 = "\x1b[49m\x1b[37m";
    goto LAB_0012b3af;
  case White_Bold:
    pcVar1 = "\x1b[49m\x1b[1;37m";
    break;
  case WhiteOnRed:
    pcVar1 = "\x1b[41m\x1b[37m";
LAB_0012b3af:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,10);
    return;
  case WhiteOnRed_Bold:
    pcVar1 = "\x1b[41m\x1b[1;37m";
    break;
  case Purple_Bold:
    pcVar1 = "\x1b[49m\x1b[1;38m";
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,0xc);
  return;
}

Assistant:

void celero::console::SetConsoleColor(const celero::console::ConsoleColor x)
{
	switch(x)
	{
		case console::ConsoleColor::Red:
			Red();
			break;
		case console::ConsoleColor::Red_Bold:
			RedBold();
			break;
		case console::ConsoleColor::Green:
			Green();
			break;
		case console::ConsoleColor::Green_Bold:
			GreenBold();
			break;
		case console::ConsoleColor::Blue:
			Blue();
			break;
		case console::ConsoleColor::Blue_Bold:
			BlueBold();
			break;
		case console::ConsoleColor::Cyan:
			Cyan();
			break;
		case console::ConsoleColor::Cyan_Bold:
			CyanBold();
			break;
		case console::ConsoleColor::Yellow:
			Yellow();
			break;
		case console::ConsoleColor::Yellow_Bold:
			YellowBold();
			break;
		case console::ConsoleColor::White:
			White();
			break;
		case console::ConsoleColor::White_Bold:
			WhiteBold();
			break;
		case console::ConsoleColor::WhiteOnRed:
			WhiteOnRed();
			break;
		case console::ConsoleColor::WhiteOnRed_Bold:
			WhiteOnRedBold();
			break;
		case console::ConsoleColor::Purple_Bold:
			PurpleBold();
			break;
		case console::ConsoleColor::Default:
		default:
			Default();
			break;
	}
}